

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O1

void Abc_NtkIvyCuts(Abc_Ntk_t *pNtk,int nInputs)

{
  Ivy_Man_t *p;
  
  p = Abc_NtkIvyBefore(pNtk,1,0);
  if (p != (Ivy_Man_t *)0x0) {
    Ivy_CutComputeAll(p,nInputs);
    Ivy_ManStop(p);
    return;
  }
  return;
}

Assistant:

void Abc_NtkIvyCuts( Abc_Ntk_t * pNtk, int nInputs )
{
    Ivy_Man_t * pMan;
    pMan = Abc_NtkIvyBefore( pNtk, 1, 0 );
    if ( pMan == NULL )
        return;
    Ivy_CutComputeAll( pMan, nInputs );
    Ivy_ManStop( pMan );
}